

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

uint32_t helper_clclu(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  ushort uVar1;
  int iVar2;
  uint32_t uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint64_t ptr;
  ulong uVar9;
  ushort uVar10;
  bool bVar11;
  uintptr_t unaff_retaddr;
  uint32_t local_6c;
  target_ulong local_68;
  
  iVar2 = r1 + 1;
  uVar4 = (env->psw).mask;
  ptr = env->regs[(int)r1];
  bVar11 = (uVar4 & 0x100000000) != 0;
  uVar6 = (ulong)((uint)env->regs[iVar2] & 0x7fffffff);
  if (bVar11) {
    uVar6 = env->regs[iVar2];
  }
  if (!bVar11) {
    if ((int)uVar4 < 0) {
      ptr = (uint64_t)((uint)ptr & 0x7fffffff);
    }
    else {
      ptr = (uint64_t)((uint)ptr & 0xffffff);
    }
  }
  iVar5 = r3 + 1;
  uVar7 = env->regs[iVar5];
  uVar9 = (ulong)((uint)uVar7 & 0x7fffffff);
  local_68 = env->regs[(int)r3];
  if ((uVar4 & 0x100000000) == 0) {
    uVar7 = uVar9;
    if ((int)uVar4 < 0) {
      local_68 = (target_ulong)((uint)local_68 & 0x7fffffff);
    }
    else {
      local_68 = (target_ulong)((uint)local_68 & 0xffffff);
    }
  }
  uVar4 = uVar7;
  if (uVar7 < uVar6) {
    uVar4 = uVar6;
  }
  if ((((uint)uVar7 | (uint)uVar6) & 1) == 0) {
    if (uVar4 == 0) {
      local_6c = 0;
    }
    else {
      local_6c = (uint)(0x1000 < uVar4) * 3;
      uVar9 = 0x1000;
      if (uVar4 < 0x1000) {
        uVar9 = uVar4;
      }
      do {
        uVar9 = uVar9 - 2;
        uVar1 = (ushort)a2;
        uVar10 = uVar1;
        if (uVar6 != 0) {
          uVar3 = cpu_lduw_data_ra_s390x(env,ptr,unaff_retaddr);
          uVar10 = (ushort)uVar3;
        }
        if (uVar7 != 0) {
          uVar3 = cpu_lduw_data_ra_s390x(env,local_68,unaff_retaddr);
          uVar1 = (ushort)uVar3;
        }
        if (uVar10 == uVar1) {
          bVar11 = uVar6 != 0;
          if (bVar11) {
            uVar6 = uVar6 - 2;
          }
          if (bVar11) {
            ptr = ptr + 2;
          }
          if (uVar7 != 0) {
            local_68 = local_68 + 2;
            uVar7 = uVar7 - 2;
          }
        }
        else {
          local_6c = 2 - (uVar10 < uVar1);
        }
      } while ((uVar10 == uVar1) && (uVar9 != 0));
    }
    if (((env->psw).mask & 0x100000000) == 0) {
      uVar6 = uVar6 & 0xffffffff | env->regs[iVar2] & 0xffffffff00000000;
    }
    env->regs[iVar2] = uVar6;
    if (((env->psw).mask & 0x100000000) == 0) {
      uVar7 = uVar7 & 0xffffffff | env->regs[iVar5] & 0xffffffff00000000;
    }
    env->regs[iVar5] = uVar7;
    uVar4 = (env->psw).mask;
    if ((uVar4 & 0x100000000) == 0) {
      if ((int)uVar4 < 0) {
        uVar8 = (uint)ptr & 0x7fffffff;
        uVar4 = env->regs[(int)r1] & 0xffffffff00000000;
      }
      else {
        uVar4 = env->regs[(int)r1] & 0xffffffffff000000;
        uVar8 = (uint)ptr & 0xffffff;
      }
      ptr = uVar8 | uVar4;
    }
    env->regs[(int)r1] = ptr;
    uVar4 = (env->psw).mask;
    if ((uVar4 & 0x100000000) == 0) {
      if ((int)uVar4 < 0) {
        uVar8 = (uint)local_68 & 0x7fffffff;
        uVar4 = env->regs[(int)r3] & 0xffffffff00000000;
      }
      else {
        uVar4 = env->regs[(int)r3] & 0xffffffffff000000;
        uVar8 = (uint)local_68 & 0xffffff;
      }
      local_68 = uVar8 | uVar4;
    }
    env->regs[(int)r3] = local_68;
    return local_6c;
  }
  tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
}

Assistant:

uint32_t HELPER(clclu)(CPUS390XState *env, uint32_t r1, uint64_t a2,
                       uint32_t r3)
{
    uintptr_t ra = GETPC();
    uint64_t src1len = get_length(env, r1 + 1);
    uint64_t src1 = get_address(env, r1);
    uint64_t src3len = get_length(env, r3 + 1);
    uint64_t src3 = get_address(env, r3);
    uint16_t pad = a2;
    uint32_t cc = 0;

    cc = do_clcl(env, &src1, &src1len, &src3, &src3len, pad, 0x1000, 2, ra);

    set_length(env, r1 + 1, src1len);
    set_length(env, r3 + 1, src3len);
    set_address(env, r1, src1);
    set_address(env, r3, src3);

    return cc;
}